

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O3

void __thiscall
slang::analysis::AnalysisScopeVisitor::checkValueUnused
          (AnalysisScopeVisitor *this,ValueSymbol *symbol,DiagCode unusedCode,
          optional<slang::DiagCode> unsetCode,optional<slang::DiagCode> unreadCode)

{
  SyntaxNode *node;
  PortBackref *pPVar1;
  pair<bool,_bool> pVar2;
  ushort uVar3;
  
  if (((this->manager->options).flags.m_bits & 1) == 0) {
    return;
  }
  node = (symbol->super_Symbol).originatingSyntax;
  if (node == (SyntaxNode *)0x0) {
    return;
  }
  if ((symbol->super_Symbol).name._M_len == 0) {
    return;
  }
  pVar2 = ast::Compilation::isReferenced(this->result->scope->compilation,node);
  uVar3 = (ushort)pVar2 >> 8;
  pPVar1 = symbol->firstPortBackref;
  if (pPVar1 == (PortBackref *)0x0) {
    if (((ushort)pVar2 & 1) == 0) {
      if (((uVar3 & 1) != 0) &&
         (unusedCode = unreadCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::DiagCode>._M_payload,
         ((uint6)unreadCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::DiagCode> & 0x100000000) == 0)) {
        return;
      }
      goto LAB_0036aaa7;
    }
    uVar3 = (ushort)(byte)(pVar2.second |
                          (((uint6)unsetCode.super__Optional_base<slang::DiagCode,_true,_true>.
                                   _M_payload.super__Optional_payload_base<slang::DiagCode> &
                           0x100000000) == 0 ||
                          (symbol->declaredType).initializerSyntax != (ExpressionSyntax *)0x0));
    unusedCode = unsetCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::DiagCode>._M_payload;
  }
  else {
    if (pPVar1->next != (PortBackref *)0x0) {
      return;
    }
    switch(((pPVar1->port).ptr)->direction) {
    case In:
      unusedCode = (DiagCode)0x26000e;
      if (((ushort)pVar2 & 1) != 0) {
        return;
      }
      goto LAB_0036aaa7;
    case InOut:
      if (((ushort)pVar2 & 1) == 0) {
        unusedCode = (DiagCode)(((byte)~pVar2.second & 1) * 0x80000 + 0x1e000e);
        goto LAB_0036aaa7;
      }
    case Out:
      unusedCode = (DiagCode)0x1a000e;
      break;
    case Ref:
      if (((ushort)pVar2 & 1) != 0) {
        return;
      }
      unusedCode = (DiagCode)0x26000e;
      break;
    default:
      goto switchD_0036aa45_default;
    }
  }
  if ((uVar3 & 1) != 0) {
switchD_0036aa45_default:
    return;
  }
LAB_0036aaa7:
  addDiag(this,&symbol->super_Symbol,unusedCode);
  return;
}

Assistant:

void checkValueUnused(const ValueSymbol& symbol, DiagCode unusedCode,
                          std::optional<DiagCode> unsetCode, std::optional<DiagCode> unreadCode) {
        if (!manager.hasFlag(AnalysisFlags::CheckUnused))
            return;

        auto syntax = symbol.getSyntax();
        if (!syntax || symbol.name.empty())
            return;

        auto [rvalue, lvalue] = isReferenced(*syntax);

        auto portRef = symbol.getFirstPortBackref();
        if (portRef) {
            // This is a variable or net connected internally to a port.
            // If there is more than one port connection something unusually
            // complicated is going on so don't try to diagnose warnings.
            if (portRef->getNextBackreference())
                return;

            // Otherwise check and warn about the port being unused.
            switch (portRef->port->direction) {
                case ArgumentDirection::In:
                    if (!rvalue)
                        addDiag(symbol, diag::UnusedPort);
                    break;
                case ArgumentDirection::Out:
                    if (!lvalue)
                        addDiag(symbol, diag::UndrivenPort);
                    break;
                case ArgumentDirection::InOut:
                    if (!rvalue && !lvalue)
                        addDiag(symbol, diag::UnusedPort);
                    else if (!rvalue)
                        addDiag(symbol, diag::UnusedButSetPort);
                    else if (!lvalue)
                        addDiag(symbol, diag::UndrivenPort);
                    break;
                case ArgumentDirection::Ref:
                    if (!rvalue && !lvalue)
                        addDiag(symbol, diag::UnusedPort);
                    break;
            }
            return;
        }

        if (!rvalue && !lvalue)
            addDiag(symbol, unusedCode);
        else if (!rvalue && unreadCode)
            addDiag(symbol, *unreadCode);
        else if (!lvalue && !symbol.getDeclaredType()->getInitializerSyntax() && unsetCode)
            addDiag(symbol, *unsetCode);
    }